

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

void __thiscall IF97::Region3::Region3(Region3 *this)

{
  size_t i;
  ulong uVar1;
  size_t i_1;
  long lVar2;
  
  memset(this,0,0x138);
  this->T_star = 1000.0;
  this->p_star = 1.0;
  lVar2 = 4;
  for (uVar1 = 0; uVar1 < (ulong)(DAT_0012cc30 - reg3rdata >> 4); uVar1 = uVar1 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->nr,(value_type_conflict *)(reg3rdata + lVar2 + 4));
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->Ir,(value_type_conflict1 *)(reg3rdata + lVar2 + -4));
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->Jr,(value_type_conflict1 *)(reg3rdata + lVar2));
    lVar2 = lVar2 + 0x10;
  }
  lVar2 = 4;
  for (uVar1 = 0; uVar1 < (ulong)(DAT_0012cb58 - Hrdata >> 4); uVar1 = uVar1 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->munr,(value_type_conflict *)(Hrdata + lVar2 + 4));
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->muIr,(value_type_conflict1 *)(Hrdata + lVar2 + -4));
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->muJr,(value_type_conflict1 *)(Hrdata + lVar2));
    lVar2 = lVar2 + 0x10;
  }
  lVar2 = 8;
  for (uVar1 = 0; uVar1 < (ulong)(DAT_0012cb70 - H0data >> 4); uVar1 = uVar1 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->mun0,(value_type_conflict *)(H0data + lVar2));
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->muJ0,(value_type_conflict1 *)(H0data + lVar2 + -8));
    lVar2 = lVar2 + 0x10;
  }
  lVar2 = 4;
  for (uVar1 = 0; uVar1 < (ulong)(DAT_0012cb88 - Lrdata >> 4); uVar1 = uVar1 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->lamnr,(value_type_conflict *)(Lrdata + lVar2 + 4));
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->lamIr,(value_type_conflict1 *)(Lrdata + lVar2 + -4));
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->lamJr,(value_type_conflict1 *)(Lrdata + lVar2));
    lVar2 = lVar2 + 0x10;
  }
  lVar2 = 8;
  for (uVar1 = 0; uVar1 < (ulong)(DAT_0012cba0 - L0data >> 4); uVar1 = uVar1 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->lamn0,(value_type_conflict *)(L0data + lVar2));
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->lamJ0,(value_type_conflict1 *)(L0data + lVar2 + -8));
    lVar2 = lVar2 + 0x10;
  }
  this->R = 0.461526;
  return;
}

Assistant:

Region3() : T_star(1000), p_star(1*p_fact) {
            for (std::size_t i = 0; i < reg3rdata.size(); ++i){
                nr.push_back(reg3rdata[i].n);
                Ir.push_back(reg3rdata[i].I);
                Jr.push_back(reg3rdata[i].J);
            }
            for (std::size_t i = 0; i < Hrdata.size(); ++i){
                munr.push_back(Hrdata[i].n);
                muIr.push_back(Hrdata[i].I);
                muJr.push_back(Hrdata[i].J);
            }
            for (std::size_t i = 0; i < H0data.size(); ++i){
                mun0.push_back(H0data[i].n);
                muJ0.push_back(H0data[i].J);
            }
            for (std::size_t i = 0; i < Lrdata.size(); ++i){
                lamnr.push_back(Lrdata[i].n);
                lamIr.push_back(Lrdata[i].I);
                lamJr.push_back(Lrdata[i].J);
            }
            for (std::size_t i = 0; i < L0data.size(); ++i){
                lamn0.push_back(L0data[i].n);
                lamJ0.push_back(L0data[i].J);
            }
            R = Rgas;
        }